

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

CPpmd_Void_Ref CutOff(CPpmd8 *p,CTX_PTR ctx,uint order)

{
  Byte *node;
  undefined4 uVar1;
  Byte *pBVar2;
  CPpmd_Void_Ref CVar3;
  byte *ptr;
  byte bVar4;
  undefined2 uVar5;
  long lVar6;
  uint indx;
  Byte *pBVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar11;
  uint nu;
  byte *pbVar12;
  Byte *pBVar10;
  
  bVar4 = ctx->NumStats;
  uVar11 = (uint)bVar4;
  pBVar7 = p->Base;
  if (bVar4 == 0) {
    if ((CTX_PTR)p->UnitsStart <= (CTX_PTR)(pBVar7 + ctx->Stats)) {
      if (order < p->MaxOrder) {
        CVar3 = CutOff(p,(CTX_PTR)(pBVar7 + ctx->Stats),order + 1);
        uVar5 = (undefined2)(CVar3 >> 0x10);
      }
      else {
        CVar3 = 0;
        uVar5 = 0;
      }
      *(short *)&ctx->Stats = (short)CVar3;
      *(undefined2 *)((long)&ctx->Stats + 2) = uVar5;
      if ((order < 10) || (ctx->Stats != 0)) goto LAB_0011d865;
    }
LAB_0011d819:
    SpecialFreeUnit(p,ctx);
    CVar3 = 0;
  }
  else {
    uVar9 = (ulong)ctx->Stats;
    node = pBVar7 + uVar9;
    nu = bVar4 + 2 >> 1;
    pBVar2 = p->UnitsStart;
    pBVar10 = node;
    if (node <= pBVar2 + 0x4000) {
      indx = (uint)p->Units2Indx[nu - 1];
      uVar8 = (ulong)p->FreeList[indx];
      if (ctx->Stats <= p->FreeList[indx]) {
        pBVar10 = pBVar7 + uVar8;
        p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar7 + uVar8 + 4);
        p->Stamps[indx] = p->Stamps[indx] - 1;
        lVar6 = 0;
        do {
          *(undefined4 *)(pBVar7 + lVar6 + uVar8) = *(undefined4 *)(pBVar7 + lVar6 + uVar9);
          *(undefined4 *)(pBVar7 + lVar6 + uVar8 + 4) = *(undefined4 *)(pBVar7 + lVar6 + uVar9 + 4);
          *(undefined4 *)(pBVar7 + lVar6 + uVar8 + 8) = *(undefined4 *)(pBVar7 + lVar6 + uVar9 + 8);
          lVar6 = lVar6 + 0xc;
        } while ((bVar4 + 2 >> 1) * 0xc - (int)lVar6 != 0);
        if (pBVar2 == node) {
          p->UnitsStart = pBVar2 + (ulong)p->Indx2Units[indx] * 0xc;
        }
        else {
          InsertNode(p,node,indx);
          pBVar7 = p->Base;
          bVar4 = ctx->NumStats;
          uVar11 = (uint)bVar4;
        }
      }
    }
    uVar9 = (long)pBVar10 - (long)pBVar7;
    ctx->Stats = (CPpmd_State_Ref)uVar9;
    pbVar12 = pBVar7 + (ulong)bVar4 * 6 + (uVar9 & 0xffffffff);
    while (ptr = pBVar7 + (uVar9 & 0xffffffff), ptr <= pbVar12) {
      if ((CTX_PTR)(pBVar7 + *(uint *)(pbVar12 + 2)) < (CTX_PTR)p->UnitsStart) {
        lVar6 = (long)(int)uVar11;
        uVar11 = uVar11 - 1;
        lVar6 = lVar6 * 6;
        pbVar12[2] = 0;
        pbVar12[3] = 0;
        pbVar12[4] = 0;
        pbVar12[5] = 0;
        uVar5 = *(undefined2 *)(pbVar12 + 4);
        uVar1 = *(undefined4 *)pbVar12;
        *(undefined2 *)(pbVar12 + 4) = *(undefined2 *)(ptr + lVar6 + 4);
        *(undefined4 *)pbVar12 = *(undefined4 *)(ptr + lVar6);
        *(undefined2 *)(ptr + lVar6 + 4) = uVar5;
        *(undefined4 *)(ptr + lVar6) = uVar1;
      }
      else if (order < p->MaxOrder) {
        CVar3 = CutOff(p,(CTX_PTR)(pBVar7 + *(uint *)(pbVar12 + 2)),order + 1);
        *(CPpmd_Void_Ref *)(pbVar12 + 2) = CVar3;
      }
      else {
        pbVar12[2] = 0;
        pbVar12[3] = 0;
        pbVar12[4] = 0;
        pbVar12[5] = 0;
      }
      pbVar12 = pbVar12 + -6;
      uVar9 = (ulong)ctx->Stats;
      pBVar7 = p->Base;
    }
    if ((order != 0) && (uVar11 != ctx->NumStats)) {
      ctx->NumStats = (Byte)uVar11;
      if ((int)uVar11 < 0) {
        FreeUnits(p,ptr,nu);
        goto LAB_0011d819;
      }
      if (uVar11 == 0) {
        ctx->Flags = (0x3f < *ptr) << 3 | ctx->Flags & 0x10;
        *(undefined4 *)&ctx->SummFreq = *(undefined4 *)ptr;
        *(undefined2 *)((long)&ctx->Stats + 2) = *(undefined2 *)(ptr + 4);
        FreeUnits(p,ptr,nu);
        *(char *)((long)&ctx->SummFreq + 1) = (char)(*(byte *)((long)&ctx->SummFreq + 1) + 0xb >> 3)
        ;
      }
      else {
        Refresh(p,ctx,nu,(uint)((int)(uVar11 * 0x10) < (int)(uint)ctx->SummFreq));
      }
    }
LAB_0011d865:
    CVar3 = (int)ctx - *(int *)&p->Base;
  }
  return CVar3;
}

Assistant:

static CPpmd_Void_Ref CutOff(CPpmd8 *p, CTX_PTR ctx, unsigned order)
{
  int i;
  unsigned tmp;
  CPpmd_State *s;
  
  if (!ctx->NumStats)
  {
    s = ONE_STATE(ctx);
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) >= p->UnitsStart)
    {
      if (order < p->MaxOrder)
        SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
      else
        SetSuccessor(s, 0);
      if (SUCCESSOR(s) || order <= 9) /* O_BOUND */
        return REF(ctx);
    }
    SpecialFreeUnit(p, ctx);
    return 0;
  }

  ctx->Stats = STATS_REF(MoveUnitsUp(p, STATS(ctx), tmp = ((unsigned)ctx->NumStats + 2) >> 1));

  for (s = STATS(ctx) + (i = ctx->NumStats); s >= STATS(ctx); s--)
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) < p->UnitsStart)
    {
      CPpmd_State *s2 = STATS(ctx) + (i--);
      SetSuccessor(s, 0);
      SwapStates(s, s2);
    }
    else if (order < p->MaxOrder)
      SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
    else
      SetSuccessor(s, 0);
    
  if (i != ctx->NumStats && order)
  {
    ctx->NumStats = (Byte)i;
    s = STATS(ctx);
    if (i < 0)
    {
      FreeUnits(p, s, tmp);
      SpecialFreeUnit(p, ctx);
      return 0;
    }
    if (i == 0)
    {
      ctx->Flags = (Byte)((ctx->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(ctx) = *s;
      FreeUnits(p, s, tmp);
      /* 9.31: the code was fixed. It's was not BUG, if Freq <= MAX_FREQ = 124 */
      ONE_STATE(ctx)->Freq = (Byte)(((unsigned)ONE_STATE(ctx)->Freq + 11) >> 3);
    }
    else
      Refresh(p, ctx, tmp, ctx->SummFreq > 16 * i);
  }
  return REF(ctx);
}